

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O3

int Ssw_ManSweepDyn(Ssw_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  void *pvVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  Aig_Man_t *pAVar10;
  Aig_Obj_t *pAVar11;
  void **ppvVar12;
  void **ppvVar13;
  Vec_Ptr_t *pVVar14;
  Bar_Progress_t *p_00;
  ulong uVar15;
  Ssw_Sat_t *pSVar16;
  ulong uVar17;
  long lVar18;
  void **ppvVar19;
  Aig_Obj_t *p1;
  int f;
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *paVar20;
  Aig_Obj_t *pAVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  timespec ts;
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 local_38;
  long local_30;
  
  paVar20 = &local_38;
  iVar7 = clock_gettime(3,(timespec *)&local_38);
  if (iVar7 < 0) {
    lVar18 = 1;
  }
  else {
    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30),8);
    lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + (long)local_38.pNext * -1000000;
  }
  pAVar10 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar10;
  Aig_ManFanoutStart(pAVar10);
  p->nSRMiterMaxId = p->pFrames->vObjs->nSize;
  iVar7 = p->pPars->nFramesK;
  p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar7] = p->pFrames->pConst1;
  pAVar10 = p->pAig;
  if (0 < pAVar10->nTruePis) {
    lVar22 = 0;
    do {
      if (pAVar10->vCis->nSize <= lVar22) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pAVar10->vCis->pArray[lVar22];
      pAVar11 = Aig_ObjCreateCi(p->pFrames);
      p->pNodeToFrames[*(int *)((long)pvVar4 + 0x24) * p->nFrames + iVar7] = pAVar11;
      lVar22 = lVar22 + 1;
      pAVar10 = p->pAig;
    } while (lVar22 < pAVar10->nTruePis);
  }
  Aig_ManSetCioIds(p->pFrames);
  Ssw_ManLabelPiNodes(p);
  iVar8 = clock_gettime(3,(timespec *)&local_38);
  if (iVar8 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = local_30 / 1000 + (long)local_38.pNext * 1000000;
  }
  p->timeReduce = p->timeReduce + lVar22 + lVar18;
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x18e,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
  }
  iVar8 = p->pFrames->nObjs[2];
  lVar18 = (long)iVar8;
  ppvVar12 = (void **)malloc(lVar18 * 0xc);
  auVar6 = _DAT_008403e0;
  if (0 < lVar18) {
    ppvVar13 = ppvVar12 + lVar18;
    uVar17 = (ulong)(iVar8 + 1U & 0xfffffffe);
    lVar18 = lVar18 + -1;
    auVar23._8_4_ = (int)lVar18;
    auVar23._0_8_ = lVar18;
    auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
    ppvVar19 = ppvVar12 + 1;
    auVar23 = auVar23 ^ _DAT_008403e0;
    auVar24 = _DAT_008403d0;
    do {
      auVar25 = auVar24 ^ auVar6;
      if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                  auVar23._4_4_ < auVar25._4_4_) & 1)) {
        ppvVar19[-1] = ppvVar13;
      }
      uVar5 = -(ushort)(auVar25._12_4_ == auVar23._12_4_ && auVar23._8_4_ < auVar25._8_4_ ||
                       auVar23._12_4_ < auVar25._12_4_) ^ 0xffff;
      paVar20 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)(ulong)uVar5;
      if ((uVar5 & 1) != 0) {
        paVar20 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)((long)ppvVar13 + 4);
        *ppvVar19 = paVar20;
      }
      lVar18 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar18 + 2;
      ppvVar19 = ppvVar19 + 2;
      ppvVar13 = ppvVar13 + 1;
      uVar17 = uVar17 - 2;
    } while (uVar17 != 0);
  }
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nSize = iVar8;
  pVVar14->nCap = iVar8;
  pVVar14->pArray = ppvVar12;
  p->vSimInfo = pVVar14;
  if (0 < iVar8) {
    lVar18 = 0;
    do {
      *(undefined4 *)pVVar14->pArray[lVar18] = 0;
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar14->nSize);
  }
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  uVar17 = 0;
  if (p->pPars->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    uVar9 = p->pAig->vObjs->nSize;
    paVar20 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)(ulong)uVar9;
    p_00 = Bar_ProgressStart(_stdout,uVar9);
  }
  iVar8 = (int)paVar20;
  p->iNodeStart = 0;
  pVVar14 = p->pAig->vObjs;
  if (0 < pVVar14->nSize) {
    uVar17 = 0;
    do {
      pAVar11 = (Aig_Obj_t *)pVVar14->pArray[uVar17];
      if (pAVar11 != (Aig_Obj_t *)0x0) {
        iVar8 = (int)uVar17;
        if (p->iNodeStart == 0) {
          p->iNodeStart = iVar8;
        }
        if ((p->pPars->fVerbose != 0) &&
           ((p_00 == (Bar_Progress_t *)0x0 || ((long)p_00->nItemsNext <= (long)uVar17)))) {
          paVar20 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)(uVar17 & 0xffffffff);
          Bar_ProgressUpdate_int(p_00,iVar8,(char *)0x0);
        }
        uVar9 = (uint)*(undefined8 *)&pAVar11->field_0x18;
        if (((uVar9 & 7) == 2) && (p->pAig->nTruePis <= (pAVar11->field_0).CioId)) {
LAB_00618561:
          uVar9 = Ssw_ManSweepNode(p,pAVar11,iVar7,0,(Vec_Int_t *)0x0);
          p->fRefined = p->fRefined | uVar9;
          paVar20 = &pAVar11->field_0;
        }
        else if (0xfffffffd < (uVar9 & 7) - 7) {
          if (((ulong)pAVar11 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar15 = (ulong)pAVar11->pFanin0 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            pAVar21 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar21 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar11->pFanin0 & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar15 + 0x24) * p->nFrames + iVar7]);
          }
          uVar15 = (ulong)pAVar11->pFanin1 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar11->pFanin1 & 1) ^
                 (ulong)p->pNodeToFrames[*(int *)(uVar15 + 0x24) * p->nFrames + iVar7]);
          }
          pAVar21 = Aig_And(p->pFrames,pAVar21,p1);
          p->pNodeToFrames[pAVar11->Id * p->nFrames + iVar7] = pAVar21;
          goto LAB_00618561;
        }
        f = (int)paVar20;
        if (p->pMSat->pSat != (sat_solver *)0x0) {
          iVar3 = p->pPars->nSatVarMax2;
          if (((iVar3 == 0) || (p->pMSat->nSatVars <= iVar3)) ||
             (p->nRecycleCalls <= p->pPars->nRecycleCalls2)) {
            if (p->nPatterns == 0x20) {
              p->iNodeLast = iVar8;
              if (p->pPars->fLocalSim == 0) {
                Ssw_ManSweepResimulateDyn(p,f);
              }
              else {
                Ssw_ManSweepResimulateDynLocal(p,f);
              }
              p->iNodeStart = iVar8 + 1;
            }
            goto LAB_00618677;
          }
        }
        if (0 < p->nPatterns) {
          p->iNodeLast = iVar8;
          if (p->pPars->fLocalSim == 0) {
            Ssw_ManSweepResimulateDyn(p,f);
          }
          else {
            Ssw_ManSweepResimulateDynLocal(p,f);
          }
          p->iNodeStart = iVar8 + 1;
        }
        Aig_ManCleanMarkAB(p->pFrames);
        Ssw_ManLabelPiNodes(p);
        pSVar16 = p->pMSat;
        if (pSVar16 != (Ssw_Sat_t *)0x0) {
          iVar8 = pSVar16->nSatVars;
          if (pSVar16->nSatVars < p->nVarsMax) {
            iVar8 = p->nVarsMax;
          }
          p->nVarsMax = iVar8;
          iVar8 = pSVar16->nSolverCalls;
          if (pSVar16->nSolverCalls < p->nCallsMax) {
            iVar8 = p->nCallsMax;
          }
          p->nCallsMax = iVar8;
          Ssw_SatStop(pSVar16);
          uVar1 = p->nRecycles;
          uVar2 = p->nRecyclesTotal;
          p->nRecycles = uVar1 + 1;
          p->nRecyclesTotal = uVar2 + 1;
          p->nRecycleCalls = 0;
        }
        pSVar16 = Ssw_SatStart(0);
        p->pMSat = pSVar16;
        if (p->nPatterns != 0) {
          __assert_fail("p->nPatterns == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                        ,0x1c7,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
        }
      }
LAB_00618677:
      iVar8 = (int)paVar20;
      uVar17 = uVar17 + 1;
      pVVar14 = p->pAig->vObjs;
    } while ((long)uVar17 < (long)pVVar14->nSize);
  }
  if (0 < p->nPatterns) {
    p->iNodeLast = (int)uVar17;
    if (p->pPars->fLocalSim == 0) {
      Ssw_ManSweepResimulateDyn(p,iVar8);
    }
    else {
      Ssw_ManSweepResimulateDynLocal(p,iVar8);
    }
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop(p_00);
  }
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepDyn( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, f;
    abctime clk;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    Aig_ManFanoutStart( p->pFrames );
    p->nSRMiterMaxId = Aig_ManObjNumMax( p->pFrames );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
    Aig_ManSetCioIds( p->pFrames );
    // label nodes corresponding to primary inputs
    Ssw_ManLabelPiNodes( p );
p->timeReduce += Abc_Clock() - clk;

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    p->iNodeStart = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->iNodeStart == 0 )
            p->iNodeStart = i;
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        }
        // check if it is time to recycle the solver
        if ( p->pMSat->pSat == NULL ||
            (p->pPars->nSatVarMax2 &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax2 &&
             p->nRecycleCalls > p->pPars->nRecycleCalls2) )
        {
            // resimulate
            if ( p->nPatterns > 0 )
            {
                p->iNodeLast = i;
                if ( p->pPars->fLocalSim )
                    Ssw_ManSweepResimulateDynLocal( p, f );
                else
                    Ssw_ManSweepResimulateDyn( p, f );
                p->iNodeStart = i+1;
            }
//                Abc_Print( 1, "Recycling SAT solver with %d vars and %d calls.\n", 
//                    p->pMSat->nSatVars, p->nRecycleCalls );
//            Aig_ManCleanMarkAB( p->pAig );
            Aig_ManCleanMarkAB( p->pFrames );
            // label nodes corresponding to primary inputs
            Ssw_ManLabelPiNodes( p );
            // replace the solver
            if ( p->pMSat )
            {
                p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
                p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
                Ssw_SatStop( p->pMSat );
                p->nRecycles++;
                p->nRecyclesTotal++;
                p->nRecycleCalls = 0;
            }
            p->pMSat = Ssw_SatStart( 0 );
            assert( p->nPatterns == 0 );
        }
        // resimulate
        if ( p->nPatterns == 32 )
        {
            p->iNodeLast = i;
            if ( p->pPars->fLocalSim )
                Ssw_ManSweepResimulateDynLocal( p, f );
            else
                Ssw_ManSweepResimulateDyn( p, f );
            p->iNodeStart = i+1;
        }
    }
    // resimulate
    if ( p->nPatterns > 0 )
    {
        p->iNodeLast = i;
        if ( p->pPars->fLocalSim )
            Ssw_ManSweepResimulateDynLocal( p, f );
        else
            Ssw_ManSweepResimulateDyn( p, f );
    }
    // collect stats
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}